

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe55At1(uint8_t *buf)

{
  return (ulong)(*buf >> 1) |
         (ulong)buf[1] << 7 |
         (ulong)((uint)buf[2] << 0xf | (uint)buf[3] << 0x17) |
         ((ulong)buf[4] | (ulong)((uint)buf[5] << 8 | (uint)buf[6] << 0x10)) << 0x1f;
}

Assistant:

std::uint64_t readFlUIntLe55At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[0] >> 1);
    res &= UINT64_C(0x7fffffffffffff);
    return res;
}